

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

void kj::anon_unknown_0::testHttpServerRequest
               (WaitScope *waitScope,Timer *timer,HttpRequestTestCase *requestCase,
               HttpResponseTestCase *responseCase,TwoWayPipe *pipe)

{
  uint uVar1;
  Own<kj::AsyncIoStream> *other;
  AsyncIoStream *pAVar2;
  char *pcVar3;
  size_t sVar4;
  RefOrVoid<kj::AsyncIoStream> pAVar5;
  StringPtr expected;
  bool local_229;
  bool _kj_shouldLog;
  Promise<void> local_218;
  Promise<void> local_208;
  Own<kj::AsyncIoStream> local_1f8;
  undefined1 local_1e8 [8];
  Promise<void> listenTask;
  undefined1 local_1b8 [8];
  HttpServer server;
  undefined1 local_f0 [8];
  TestHttpService service;
  HttpHeaderTable table;
  TwoWayPipe *pipe_local;
  HttpResponseTestCase *responseCase_local;
  HttpRequestTestCase *requestCase_local;
  Timer *timer_local;
  WaitScope *waitScope_local;
  
  HttpHeaderTable::HttpHeaderTable((HttpHeaderTable *)&service.requestCount);
  TestHttpService::TestHttpService
            ((TestHttpService *)local_f0,requestCase,responseCase,
             (HttpHeaderTable *)&service.requestCount);
  listenTask.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  HttpServerSettings::HttpServerSettings
            ((HttpServerSettings *)&listenTask.super_PromiseBase.node.ptr);
  HttpServer::HttpServer
            ((HttpServer *)local_1b8,timer,(HttpHeaderTable *)&service.requestCount,
             (HttpService *)local_f0,(Settings)ZEXT832(listenTask.super_PromiseBase.node.ptr));
  other = mv<kj::Own<kj::AsyncIoStream>>(pipe->ends);
  Own<kj::AsyncIoStream>::Own(&local_1f8,other);
  HttpServer::listenHttp((HttpServer *)local_1e8,(Own<kj::AsyncIoStream> *)local_1b8);
  Own<kj::AsyncIoStream>::~Own(&local_1f8);
  pAVar2 = Own<kj::AsyncIoStream>::operator->(pipe->ends + 1);
  pcVar3 = StringPtr::begin(&requestCase->raw);
  sVar4 = StringPtr::size(&requestCase->raw);
  (**(pAVar2->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_208,&pAVar2->super_AsyncOutputStream,pcVar3,sVar4);
  Promise<void>::wait(&local_208,waitScope);
  Promise<void>::~Promise(&local_208);
  pAVar2 = Own<kj::AsyncIoStream>::operator->(pipe->ends + 1);
  (*(pAVar2->super_AsyncInputStream)._vptr_AsyncInputStream[4])();
  pAVar5 = Own<kj::AsyncIoStream>::operator*(pipe->ends + 1);
  expected.content.size_ = (size_t)(responseCase->raw).content.ptr;
  expected.content.ptr = (char *)pAVar5;
  expectRead((AsyncInputStream *)&local_218,expected);
  Promise<void>::wait(&local_218,waitScope);
  Promise<void>::~Promise(&local_218);
  Promise<void>::wait((Promise<void> *)local_1e8,waitScope);
  uVar1 = TestHttpService::getRequestCount((TestHttpService *)local_f0);
  if (uVar1 != 1) {
    local_229 = _::Debug::shouldLog(ERROR);
    while (local_229 != false) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x287,ERROR,"\"failed: expected \" \"service.getRequestCount() == 1\"",
                 (char (*) [48])"failed: expected service.getRequestCount() == 1");
      local_229 = false;
    }
  }
  Promise<void>::~Promise((Promise<void> *)local_1e8);
  HttpServer::~HttpServer((HttpServer *)local_1b8);
  TestHttpService::~TestHttpService((TestHttpService *)local_f0);
  HttpHeaderTable::~HttpHeaderTable((HttpHeaderTable *)&service.requestCount);
  return;
}

Assistant:

void testHttpServerRequest(kj::WaitScope& waitScope, kj::Timer& timer,
                           const HttpRequestTestCase& requestCase,
                           const HttpResponseTestCase& responseCase,
                           kj::TwoWayPipe pipe) {
  HttpHeaderTable table;
  TestHttpService service(requestCase, responseCase, table);
  HttpServer server(timer, table, service);

  auto listenTask = server.listenHttp(kj::mv(pipe.ends[0]));

  pipe.ends[1]->write(requestCase.raw.begin(), requestCase.raw.size()).wait(waitScope);
  pipe.ends[1]->shutdownWrite();

  expectRead(*pipe.ends[1], responseCase.raw).wait(waitScope);

  listenTask.wait(waitScope);

  KJ_EXPECT(service.getRequestCount() == 1);
}